

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_addl(TCGContext_conflict1 *tcg_ctx,int size,_Bool is_sub,TCGv_i64 tcg_res,
                  TCGv_i64 tcg_op1,TCGv_i64 tcg_op2)

{
  NeonGenTwo64OpFn *genfn;
  TCGv_i64 tcg_op2_local;
  TCGv_i64 tcg_op1_local;
  TCGv_i64 tcg_res_local;
  _Bool is_sub_local;
  int size_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size < 3) {
    (*gen_neon_addl::fns[size][is_sub])(tcg_ctx,tcg_res,tcg_op1,tcg_op2);
    return;
  }
  __assert_fail("size < 3",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x29ec,"void gen_neon_addl(TCGContext *, int, _Bool, TCGv_i64, TCGv_i64, TCGv_i64)"
               );
}

Assistant:

static inline void gen_neon_addl(TCGContext *tcg_ctx, int size)
{
    switch (size) {
    case 0: gen_helper_neon_addl_u16(tcg_ctx, CPU_V001); break;
    case 1: gen_helper_neon_addl_u32(tcg_ctx, CPU_V001); break;
    case 2: tcg_gen_add_i64(tcg_ctx, CPU_V001); break;
    default: abort();
    }
}